

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_atexit.c
# Opt level: O1

void zt_atexit(_func_void_void_ptr *fn,void *data)

{
  zt_elist *pzVar1;
  
  pzVar1 = (zt_elist *)zt_calloc_p(1,0x20);
  if (cb_stack.next == &cb_stack) {
    atexit(_atexit_call);
  }
  pzVar1[1].prev = (zt_elist *)fn;
  pzVar1[1].next = (zt_elist *)data;
  (cb_stack.next)->prev = pzVar1;
  pzVar1->next = cb_stack.next;
  pzVar1->prev = &cb_stack;
  cb_stack.next = pzVar1;
  return;
}

Assistant:

void
zt_atexit(void (*fn)(void * data), void * data) {
    struct zt_atexit_cb * cb;

    zt_assert(fn);

    cb = zt_calloc(struct zt_atexit_cb, 1);

    if(zt_stack_empty(&cb_stack)) {
        atexit(_atexit_call);
    }

    cb->fn = fn;
    cb->data = data;

    zt_stack_push(&cb_stack, &cb->member);
}